

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProcessing.cpp
# Opt level: O0

void drawLine(Vec2f *line,Mat *img,Scalar *rgb)

{
  float fVar1;
  float *pfVar2;
  double dVar3;
  MatSize local_a0 [4];
  int local_9c;
  Point_<int> local_98;
  Point_<int> local_90;
  _InputOutputArray local_88;
  int local_6c [2];
  int local_64 [2];
  Point_<int> local_5c [2];
  Point_<int> local_48;
  _InputOutputArray local_40;
  float local_28;
  float local_24;
  float c;
  float m;
  Scalar *rgb_local;
  Mat *img_local;
  Vec2f *line_local;
  
  _c = rgb;
  rgb_local = (Scalar *)img;
  img_local = (Mat *)line;
  pfVar2 = cv::Vec<float,_2>::operator[](line,1);
  if ((*pfVar2 != 0.0) || (NAN(*pfVar2))) {
    pfVar2 = cv::Vec<float,_2>::operator[](line,1);
    dVar3 = std::tan((double)(ulong)(uint)*pfVar2);
    local_24 = -1.0 / SUB84(dVar3,0);
    pfVar2 = cv::Vec<float,_2>::operator[](line,0);
    fVar1 = *pfVar2;
    pfVar2 = cv::Vec<float,_2>::operator[](line,1);
    dVar3 = std::sin((double)(ulong)(uint)*pfVar2);
    local_28 = fVar1 / SUB84(dVar3,0);
    cv::_InputOutputArray::_InputOutputArray(&local_40,(Mat *)rgb_local);
    cv::Point_<int>::Point_(&local_48,0,(int)local_28);
    cv::MatSize::operator()((MatSize *)local_64);
    fVar1 = local_24;
    cv::MatSize::operator()((MatSize *)local_6c);
    cv::Point_<int>::Point_(local_5c,local_64[0],(int)(fVar1 * (float)local_6c[0] + local_28));
    cv::line(&local_40,&local_48,local_5c,rgb,1,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_40);
  }
  else {
    cv::_InputOutputArray::_InputOutputArray(&local_88,(Mat *)rgb_local);
    pfVar2 = cv::Vec<float,_2>::operator[](line,0);
    cv::Point_<int>::Point_(&local_90,(int)*pfVar2,0);
    pfVar2 = cv::Vec<float,_2>::operator[](line,0);
    fVar1 = *pfVar2;
    cv::MatSize::operator()(local_a0);
    cv::Point_<int>::Point_(&local_98,(int)fVar1,local_9c);
    cv::line(&local_88,&local_90,&local_98,rgb,1,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_88);
  }
  return;
}

Assistant:

void drawLine(Vec2f line, Mat &img, Scalar rgb = CV_RGB(0,0,255)){
    if(line[1]!=0){
        float m = -1/tan(line[1]);

        float c = line[0]/sin(line[1]);

        cv::line(img, Point(0, c), Point(img.size().width, m*img.size().width+c), rgb);
    }
    else{
        cv::line(img, Point(line[0], 0), Point(line[0], img.size().height), rgb);
    }

}